

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool __thiscall
ON_BoundingBox::Intersection(ON_BoundingBox *this,ON_Line *line,double *t0,double *t1)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  ON_Interval Li;
  ON_Interval ti;
  ON_Interval t;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  ON_Interval::ON_Interval(&local_40,-1.79769313486232e+308,1.79769313486232e+308);
  ON_Interval::ON_Interval(&local_50);
  ON_Interval::ON_Interval(&local_60);
  for (uVar4 = 0; uVar4 != 3; uVar4 = uVar4 + 1) {
    dVar5 = (&(line->from).x)[uVar4];
    dVar2 = (&(line->to).x)[uVar4];
    if ((dVar5 != dVar2) || (NAN(dVar5) || NAN(dVar2))) {
      local_60.m_t[0] = dVar5;
      local_60.m_t[1] = dVar2;
      local_50.m_t[0] = ON_Interval::NormalizedParameterAt(&local_60,(&(this->m_min).x)[uVar4]);
      local_50.m_t[1] = ON_Interval::NormalizedParameterAt(&local_60,(&(this->m_max).x)[uVar4]);
      bVar3 = ON_Interval::Intersection(&local_40,&local_50);
      if (!bVar3) goto LAB_0040a148;
    }
    else if ((dVar5 < (&(this->m_min).x)[uVar4]) ||
            (pdVar1 = &(this->m_max).x + uVar4, *pdVar1 <= dVar5 && dVar5 != *pdVar1))
    goto LAB_0040a148;
  }
  if (t0 != (double *)0x0) {
    dVar5 = ON_Interval::Min(&local_40);
    *t0 = dVar5;
  }
  if (t1 != (double *)0x0) {
    dVar5 = ON_Interval::Max(&local_40);
    *t1 = dVar5;
  }
LAB_0040a148:
  return 2 < uVar4;
}

Assistant:

bool ON_BoundingBox::Intersection(				//Returns true when intersect is non-empty. 
				 const ON_Line& line,		//Infinite Line segment to intersect with 
				 double* t0 ,			// t0  parameter of first intersection point
				 double* t1       // t1  parameter of last intersection point (t0<=t1)   
				 ) const
{		 
	ON_Interval t(-ON_DBL_MAX, ON_DBL_MAX), ti, Li;
  const double* boxmin = &m_min.x;
  const double* boxmax = &m_max.x;
  const double* from   = &line.from.x;
  const double* to     = &line.to.x;
	for(int i=0; i<3; i++)
  {
		if( from[i] == to[i] )
    {
			if( from[i] < boxmin[i] || from[i] > boxmax[i] )
				return false;
		} 
    else 
    {
      Li.m_t[0] = from[i];
      Li.m_t[1] = to[i];
			ti.m_t[0] = Li.NormalizedParameterAt( boxmin[i]); 
			ti.m_t[1] = Li.NormalizedParameterAt( boxmax[i]);
			if ( !t.Intersection(ti) )
        return false;
		}
	}	

	if(t0)
		*t0 = t.Min();
	if(t1)
		*t1 = t.Max();
	return true;
}